

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::timestamp_t,duckdb::date_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool,false,false>
               (string_t *ldata,timestamp_t *rdata,date_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  date_t dVar2;
  ulong uVar3;
  timestamp_t tVar4;
  ulong uVar5;
  char **ppcVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  string_t specifier;
  string_t specifier_00;
  string_t specifier_01;
  char **local_70;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      local_70 = &(ldata->value).pointer.ptr;
      iVar7 = 0;
      tVar4.value = count;
      do {
        specifier_01.value.pointer.ptr = (char *)rdata[iVar7].value;
        specifier_01.value._0_8_ = *local_70;
        dVar2 = DateTruncBinaryOperator::
                Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::date_t>
                          (*(DateTruncBinaryOperator **)(local_70 + -1),specifier_01,tVar4);
        result_data[iVar7].days = dVar2.days;
        iVar7 = iVar7 + 1;
        local_70 = local_70 + 2;
      } while (count != iVar7);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar3 = 0;
    uVar10 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar5 = 0xffffffffffffffff;
      }
      else {
        uVar5 = puVar1[uVar3];
      }
      uVar9 = uVar10 + 0x40;
      if (count <= uVar10 + 0x40) {
        uVar9 = count;
      }
      uVar8 = uVar9;
      if (uVar5 != 0) {
        uVar8 = uVar10;
        if (uVar5 == 0xffffffffffffffff) {
          if (uVar10 < uVar9) {
            ppcVar6 = &ldata[uVar10].value.pointer.ptr;
            tVar4.value = uVar3;
            do {
              specifier.value.pointer.ptr = (char *)rdata[uVar10].value;
              specifier.value._0_8_ = *ppcVar6;
              dVar2 = DateTruncBinaryOperator::
                      Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::date_t>
                                (*(DateTruncBinaryOperator **)(ppcVar6 + -1),specifier,tVar4);
              result_data[uVar10].days = dVar2.days;
              uVar10 = uVar10 + 1;
              ppcVar6 = ppcVar6 + 2;
              uVar8 = uVar10;
            } while (uVar9 != uVar10);
          }
        }
        else if (uVar10 < uVar9) {
          ppcVar6 = &ldata[uVar10].value.pointer.ptr;
          uVar8 = 0;
          tVar4.value = uVar3;
          do {
            if ((uVar5 >> (uVar8 & 0x3f) & 1) != 0) {
              specifier_00.value.pointer.ptr = (char *)rdata[uVar10 + uVar8].value;
              specifier_00.value._0_8_ = *ppcVar6;
              dVar2 = DateTruncBinaryOperator::
                      Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::date_t>
                                (*(DateTruncBinaryOperator **)(ppcVar6 + -1),specifier_00,tVar4);
              (result_data + uVar10)[uVar8].days = dVar2.days;
              tVar4.value = (int64_t)(result_data + uVar10);
            }
            uVar8 = uVar8 + 1;
            ppcVar6 = ppcVar6 + 2;
          } while ((uVar10 - uVar9) + uVar8 != 0);
          uVar8 = uVar10 + uVar8;
        }
      }
      uVar3 = uVar3 + 1;
      uVar10 = uVar8;
    } while (uVar3 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}